

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcOccupant::IfcOccupant(IfcOccupant *this)

{
  IfcOccupant *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x120,"IfcOccupant");
  IfcActor::IfcActor(&this->super_IfcActor,&PTR_construction_vtable_24__00e38b40);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcOccupant,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcOccupant,_1UL> *)
             &(this->super_IfcActor).field_0xf0,&PTR_construction_vtable_24__00e38bf0);
  *(undefined8 *)&(this->super_IfcActor).super_IfcObject = 0xe38a60;
  *(undefined8 *)&this->field_0x120 = 0xe38b28;
  *(undefined8 *)&(this->super_IfcActor).super_IfcObject.field_0x88 = 0xe38a88;
  (this->super_IfcActor).super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>
  ._vptr_ObjectHelper = (_func_int **)0xe38ab0;
  *(undefined8 *)&(this->super_IfcActor).super_IfcObject.field_0xd0 = 0xe38ad8;
  *(undefined8 *)&(this->super_IfcActor).field_0xf0 = 0xe38b00;
  std::__cxx11::string::string((string *)&(this->super_IfcActor).field_0x100);
  return;
}

Assistant:

IfcOccupant() : Object("IfcOccupant") {}